

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O2

int __thiscall particleSamples::read_in_particle_samples_binary(particleSamples *this)

{
  ifstream *piVar1;
  vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
  *this_00;
  int i;
  long lVar2;
  int ipart;
  int iVar3;
  ulong uVar4;
  int pdg;
  int n_particle;
  ulong local_e0;
  float array [9];
  float temp;
  uint uStack_a4;
  double local_a0;
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  
  clear_out_previous_record(this,this->full_particle_list);
  piVar1 = &this->inputfile;
  uVar4 = 0;
  while( true ) {
    if (this->event_buffer_size <= (int)uVar4) {
      return 0;
    }
    n_particle = 0;
    std::istream::read((char *)piVar1,(long)&n_particle);
    if (((&this->field_0x1e8)[*(long *)(*(long *)&this->inputfile + -0x18)] & 2) != 0) break;
    this_00 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
               *)this->full_particle_list;
    local_e0 = uVar4;
    _temp = (undefined8 *)operator_new(0x18);
    *_temp = 0;
    _temp[1] = 0;
    _temp[2] = 0;
    std::
    vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
    ::emplace_back<std::vector<particle_info,std::allocator<particle_info>>*>
              (this_00,(vector<particle_info,_std::allocator<particle_info>_> **)&temp);
    for (iVar3 = 0; iVar3 < n_particle; iVar3 = iVar3 + 1) {
      pdg = 0;
      std::istream::read((char *)piVar1,(long)&pdg);
      for (lVar2 = 0; lVar2 != 9; lVar2 = lVar2 + 1) {
        _temp = (undefined8 *)((ulong)uStack_a4 << 0x20);
        std::istream::read((char *)piVar1,(long)&temp);
        array[lVar2] = temp;
      }
      local_a0 = (double)array[0];
      _temp = (undefined8 *)CONCAT44(uStack_a4,pdg);
      local_70._8_4_ = SUB84((double)SUB84(array._8_8_,4),0);
      local_70._0_8_ = (double)(float)array._8_8_;
      local_70._12_4_ = (int)((ulong)(double)SUB84(array._8_8_,4) >> 0x20);
      local_60._8_4_ = SUB84((double)array[1],0);
      local_60._0_8_ = (double)array[4];
      local_60._12_4_ = (int)((ulong)(double)array[1] >> 0x20);
      local_90._8_4_ = SUB84((double)SUB84(array._24_8_,4),0);
      local_90._0_8_ = (double)(float)array._24_8_;
      local_90._12_4_ = (int)((ulong)(double)SUB84(array._24_8_,4) >> 0x20);
      local_80._8_4_ = SUB84((double)array[5],0);
      local_80._0_8_ = (double)array[8];
      local_80._12_4_ = (int)((ulong)(double)array[5] >> 0x20);
      std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                (*(this->full_particle_list->
                  super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                  )._M_impl.super__Vector_impl_data._M_start,(value_type *)&temp);
    }
    uVar4 = (ulong)(uint)((int)local_e0 + n_particle);
  }
  return 0;
}

Assistant:

int particleSamples::read_in_particle_samples_binary() {
    // clean out the previous record
    clear_out_previous_record(full_particle_list);
    int ievent = 0;
    int num_particles = 0;
    while (num_particles < event_buffer_size) {
        int n_particle = 0;
        inputfile.read(reinterpret_cast<char *>(&n_particle), sizeof(int));

        if (inputfile.eof()) break;

        // create one event
        full_particle_list->push_back(new vector<particle_info>);

        // std::cout << "Read in " << n_particle << " particles" << std::endl;
        for (int ipart = 0; ipart < n_particle; ipart++) {
            int pdg = 0;
            inputfile.read(reinterpret_cast<char *>(&pdg), sizeof(int));
            float array[9];
            for (int i = 0; i < 9; i++) {
                float temp = 0.;
                inputfile.read(reinterpret_cast<char *>(&temp), sizeof(float));
                array[i] = temp;
            }

            particle_info temp_particle_info;
            temp_particle_info.monval = pdg;
            temp_particle_info.mass = array[0];
            temp_particle_info.t = array[1];
            temp_particle_info.x = array[2];
            temp_particle_info.y = array[3];
            temp_particle_info.z = array[4];
            temp_particle_info.E = array[5];
            temp_particle_info.px = array[6];
            temp_particle_info.py = array[7];
            temp_particle_info.pz = array[8];

            (*full_particle_list)[ievent]->push_back(temp_particle_info);
        }
        num_particles += n_particle;
    }
    return (0);
}